

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::TokenStream::loadBuffer(TokenStream *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 *puVar6;
  byte local_131;
  value_type local_128;
  value_type local_100;
  value_type local_d8;
  ulong local_b0;
  size_t i;
  string local_a0 [8];
  string opt;
  undefined1 local_78 [48];
  value_type local_48;
  long local_20;
  size_type delimiterPos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next;
  TokenStream *this_local;
  
  next = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::resize
            (&this->m_tokenBuffer,0);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&this->it,&this->itEnd);
    local_131 = 0;
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&this->it);
      local_131 = ::std::__cxx11::string::empty();
    }
    if ((local_131 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&this->it);
  }
  bVar2 = __gnu_cxx::operator!=(&this->it,&this->itEnd);
  if (bVar2) {
    delimiterPos = (size_type)
                   __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&this->it);
    pcVar3 = (char *)::std::__cxx11::string::operator[](delimiterPos);
    bVar2 = isOptPrefix(*pcVar3);
    if (bVar2) {
      local_20 = ::std::__cxx11::string::find_first_of((char *)delimiterPos,0x20c6b8);
      if (local_20 == -1) {
        pcVar3 = (char *)::std::__cxx11::string::operator[](delimiterPos);
        if ((*pcVar3 == '-') || (uVar4 = ::std::__cxx11::string::size(), uVar4 < 3)) {
          local_100.type = Option;
          ::std::__cxx11::string::string((string *)&local_100.token,(string *)delimiterPos);
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          push_back(&this->m_tokenBuffer,&local_100);
          Token::~Token(&local_100);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    (local_a0,"- ",(allocator<char> *)((long)&i + 7));
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
          for (local_b0 = 1; uVar4 = local_b0, uVar5 = ::std::__cxx11::string::size(), uVar4 < uVar5
              ; local_b0 = local_b0 + 1) {
            puVar6 = (undefined1 *)::std::__cxx11::string::operator[](delimiterPos);
            uVar1 = *puVar6;
            puVar6 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)local_a0);
            *puVar6 = uVar1;
            local_d8.type = Option;
            ::std::__cxx11::string::string((string *)&local_d8.token,local_a0);
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            push_back(&this->m_tokenBuffer,&local_d8);
            Token::~Token(&local_d8);
          }
          ::std::__cxx11::string::~string(local_a0);
        }
      }
      else {
        local_48.type = Option;
        ::std::__cxx11::string::substr((ulong)&local_48.token,delimiterPos);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        push_back(&this->m_tokenBuffer,&local_48);
        Token::~Token(&local_48);
        opt.field_2._8_4_ = 1;
        ::std::__cxx11::string::substr((ulong)local_78,delimiterPos);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        push_back(&this->m_tokenBuffer,(value_type *)((long)&opt.field_2 + 8));
        Token::~Token((Token *)((long)&opt.field_2 + 8));
      }
    }
    else {
      local_128.type = Argument;
      ::std::__cxx11::string::string((string *)&local_128.token,(string *)delimiterPos);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      push_back(&this->m_tokenBuffer,&local_128);
      Token::~Token(&local_128);
    }
  }
  return;
}

Assistant:

void loadBuffer() {
            m_tokenBuffer.resize( 0 );

            // Skip any empty strings
            while( it != itEnd && it->empty() )
                ++it;

            if( it != itEnd ) {
                auto const &next = *it;
                if( isOptPrefix( next[0] ) ) {
                    auto delimiterPos = next.find_first_of( " :=" );
                    if( delimiterPos != std::string::npos ) {
                        m_tokenBuffer.push_back( { TokenType::Option, next.substr( 0, delimiterPos ) } );
                        m_tokenBuffer.push_back( { TokenType::Argument, next.substr( delimiterPos + 1 ) } );
                    } else {
                        if( next[1] != '-' && next.size() > 2 ) {
                            std::string opt = "- ";
                            for( size_t i = 1; i < next.size(); ++i ) {
                                opt[1] = next[i];
                                m_tokenBuffer.push_back( { TokenType::Option, opt } );
                            }
                        } else {
                            m_tokenBuffer.push_back( { TokenType::Option, next } );
                        }
                    }
                } else {
                    m_tokenBuffer.push_back( { TokenType::Argument, next } );
                }
            }
        }